

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

bool __thiscall QFont::operator==(QFont *this,QFont *f)

{
  qreal *pqVar1;
  double dVar2;
  byte bVar3;
  QFixed QVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  QFontPrivate *pQVar8;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  QExplicitlySharedDataPointer<QFontPrivate> *in_stack_ffffffffffffff90;
  QHash<QFont::Tag,_unsigned_int> *lhs;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  bool local_39;
  bool local_29;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = ::operator==(in_stack_ffffffffffffff90,
                       (QExplicitlySharedDataPointer<QFontPrivate> *)
                       CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  local_29 = true;
  if (!bVar6) {
    QExplicitlySharedDataPointer<QFontPrivate>::operator->
              ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712e0f);
    QExplicitlySharedDataPointer<QFontPrivate>::operator->
              ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712e22);
    bVar6 = QFontDef::operator==
                      ((QFontDef *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (QFontDef *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    local_39 = false;
    if (bVar6) {
      pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712e4f);
      dVar2 = (pQVar8->request).pointSize;
      pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712e64);
      pqVar1 = &(pQVar8->request).pointSize;
      local_39 = false;
      if ((dVar2 == *pqVar1) && (!NAN(dVar2) && !NAN(*pqVar1))) {
        pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                           ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712e8e);
        bVar3 = pQVar8->field_0x7c;
        pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                           ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712ea4);
        local_39 = false;
        if ((bVar3 & 1) == (pQVar8->field_0x7c & 1)) {
          pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                             ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712ec8);
          bVar3 = pQVar8->field_0x7c;
          pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                             ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712ee0);
          local_39 = false;
          if ((bVar3 >> 1 & 1) == ((byte)pQVar8->field_0x7c >> 1 & 1)) {
            pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                               ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712f06);
            uVar7 = (uint)((byte)pQVar8->field_0x7c >> 2 & 1);
            pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                               ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712f1f);
            local_39 = false;
            if (uVar7 == ((byte)pQVar8->field_0x7c >> 2 & 1)) {
              pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                                 ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712f46);
              uVar7 = (uint)((byte)pQVar8->field_0x7c >> 3 & 1);
              pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                                 ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712f5f);
              local_39 = false;
              if (uVar7 == ((byte)pQVar8->field_0x7c >> 3 & 1)) {
                pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                                   ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712f86);
                uVar7 = (uint)((byte)pQVar8->field_0x7c >> 4 & 7);
                pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                                   ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712f9f);
                local_39 = false;
                if (uVar7 == ((byte)pQVar8->field_0x7c >> 4 & 7)) {
                  pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                                     ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712fc6);
                  uVar7 = (uint)((byte)pQVar8->field_0x7c >> 7);
                  pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                                     ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712fdf);
                  local_39 = false;
                  if (uVar7 == (byte)pQVar8->field_0x7c >> 7) {
                    pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x713006);
                    QVar4.val = (pQVar8->letterSpacing).val;
                    pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x71301a);
                    bVar6 = ::operator==(QVar4,(QFixed)(pQVar8->letterSpacing).val);
                    local_39 = false;
                    if (bVar6) {
                      pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                                         ((QExplicitlySharedDataPointer<QFontPrivate> *)0x71304a);
                      QVar4.val = (pQVar8->wordSpacing).val;
                      pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                                         ((QExplicitlySharedDataPointer<QFontPrivate> *)0x71305e);
                      bVar6 = ::operator==(QVar4,(QFixed)(pQVar8->wordSpacing).val);
                      local_39 = false;
                      if (bVar6) {
                        pQVar8 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                                           ((QExplicitlySharedDataPointer<QFontPrivate> *)0x71308e);
                        lhs = &pQVar8->features;
                        QExplicitlySharedDataPointer<QFontPrivate>::operator->
                                  ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7130a3);
                        local_39 = operator==<QFont::Tag,_unsigned_int,_true>
                                             (lhs,(QHash<QFont::Tag,_unsigned_int> *)
                                                  CONCAT17(in_stack_ffffffffffffff8f,
                                                           in_stack_ffffffffffffff88));
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_29 = local_39;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool QFont::operator==(const QFont &f) const
{
    return (f.d == d
            || (f.d->request   == d->request
                && f.d->request.pointSize == d->request.pointSize
                && f.d->underline == d->underline
                && f.d->overline  == d->overline
                && f.d->strikeOut == d->strikeOut
                && f.d->kerning == d->kerning
                && f.d->capital == d->capital
                && f.d->letterSpacingIsAbsolute == d->letterSpacingIsAbsolute
                && f.d->letterSpacing == d->letterSpacing
                && f.d->wordSpacing == d->wordSpacing
                && f.d->features == d->features
            ));
}